

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxList.cpp
# Opt level: O2

BoxList * __thiscall amrex::BoxList::intersect(BoxList *this,Box *b)

{
  pointer pBVar1;
  undefined8 uVar2;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> *__range1;
  pointer pBVar3;
  Box lhs;
  Box local_58;
  
  pBVar1 = (this->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pBVar3 = (this->m_lbox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_start; pBVar3 != pBVar1; pBVar3 = pBVar3 + 1) {
    local_58.smallend.vect._0_8_ = *(undefined8 *)(pBVar3->smallend).vect;
    uVar2 = *(undefined8 *)((pBVar3->smallend).vect + 2);
    local_58._20_8_ = *(undefined8 *)((pBVar3->bigend).vect + 2);
    local_58.bigend.vect[1] = (int)((ulong)*(undefined8 *)(pBVar3->bigend).vect >> 0x20);
    local_58.smallend.vect[2] = (int)uVar2;
    local_58.bigend.vect[0] = (int)((ulong)uVar2 >> 0x20);
    Box::operator&=(&local_58,b);
    if ((((local_58.bigend.vect[0] < local_58.smallend.vect[0]) ||
         (local_58.bigend.vect[1] < local_58.smallend.vect[1])) ||
        (local_58.bigend.vect[2] < local_58.smallend.vect[2])) || (7 < local_58.btype.itype)) {
      (pBVar3->smallend).vect[0] = 1;
      (pBVar3->smallend).vect[1] = 1;
      (pBVar3->smallend).vect[2] = 1;
      (pBVar3->bigend).vect[0] = 0;
      (pBVar3->bigend).vect[1] = 0;
      *(undefined8 *)((pBVar3->bigend).vect + 2) = 0;
    }
    else {
      *(ulong *)(pBVar3->bigend).vect = CONCAT44(local_58.bigend.vect[1],local_58.bigend.vect[0]);
      *(undefined8 *)((pBVar3->bigend).vect + 2) = local_58._20_8_;
      *(undefined8 *)(pBVar3->smallend).vect = local_58.smallend.vect._0_8_;
      *(ulong *)((pBVar3->smallend).vect + 2) =
           CONCAT44(local_58.bigend.vect[0],local_58.smallend.vect[2]);
    }
  }
  removeEmpty(this);
  return this;
}

Assistant:

BoxList&
BoxList::intersect (const Box& b)
{
    BL_ASSERT(ixType() == b.ixType());

    for (Box& bx : m_lbox)
    {
        const Box& isect = bx & b;
        if (isect.ok())
        {
            bx = isect;
        }
        else
        {
            bx = Box();
        }
    }

    removeEmpty();

    return *this;
}